

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O3

PropertyID lunasvg::propertyid(string_view *name)

{
  ulong __n;
  char *__s2;
  PropertyID PVar1;
  int iVar2;
  ulong __n_00;
  anon_struct_24_2_b8fd76e8 *paVar3;
  difference_type __d;
  ulong uVar4;
  long lVar6;
  ulong uVar5;
  
  __n = name->_M_len;
  __s2 = name->_M_str;
  paVar3 = propertyid::table;
  uVar5 = 0x2f;
  do {
    uVar4 = uVar5 >> 1;
    __n_00 = paVar3[uVar4].name._M_len;
    lVar6 = __n_00 - __n;
    if (__n <= __n_00) {
      __n_00 = __n;
    }
    if (__n_00 == 0) {
LAB_0011ef23:
      if (lVar6 < -0x7fffffff) {
        lVar6 = -0x80000000;
      }
      if (0x7ffffffe < lVar6) {
        lVar6 = 0x7fffffff;
      }
      iVar2 = (int)lVar6;
    }
    else {
      iVar2 = memcmp(paVar3[uVar4].name._M_str,__s2,__n_00);
      if (iVar2 == 0) goto LAB_0011ef23;
    }
    if (iVar2 < 0) {
      paVar3 = paVar3 + uVar4 + 1;
      uVar4 = ~uVar4 + uVar5;
    }
    uVar5 = uVar4;
  } while (0 < (long)uVar4);
  if ((paVar3 != (anon_struct_24_2_b8fd76e8 *)&DAT_0015a968) && ((paVar3->name)._M_len == __n)) {
    if (__n != 0) {
      iVar2 = bcmp((paVar3->name)._M_str,__s2,__n);
      if (iVar2 != 0) goto LAB_0011ef8a;
    }
    return paVar3->value;
  }
LAB_0011ef8a:
  PVar1 = csspropertyid(name);
  return PVar1;
}

Assistant:

PropertyID propertyid(const std::string_view& name)
{
    static const struct {
        std::string_view name;
        PropertyID value;
    } table[] = {
        {"class", PropertyID::Class},
        {"clipPathUnits", PropertyID::ClipPathUnits},
        {"cx", PropertyID::Cx},
        {"cy", PropertyID::Cy},
        {"d", PropertyID::D},
        {"dx", PropertyID::Dx},
        {"dy", PropertyID::Dy},
        {"fx", PropertyID::Fx},
        {"fy", PropertyID::Fy},
        {"gradientTransform", PropertyID::GradientTransform},
        {"gradientUnits", PropertyID::GradientUnits},
        {"height", PropertyID::Height},
        {"href", PropertyID::Href},
        {"id", PropertyID::Id},
        {"lengthAdjust", PropertyID::LengthAdjust},
        {"markerHeight", PropertyID::MarkerHeight},
        {"markerUnits", PropertyID::MarkerUnits},
        {"markerWidth", PropertyID::MarkerWidth},
        {"maskContentUnits", PropertyID::MaskContentUnits},
        {"maskUnits", PropertyID::MaskUnits},
        {"offset", PropertyID::Offset},
        {"orient", PropertyID::Orient},
        {"patternContentUnits", PropertyID::PatternContentUnits},
        {"patternTransform", PropertyID::PatternTransform},
        {"patternUnits", PropertyID::PatternUnits},
        {"points", PropertyID::Points},
        {"preserveAspectRatio", PropertyID::PreserveAspectRatio},
        {"r", PropertyID::R},
        {"refX", PropertyID::RefX},
        {"refY", PropertyID::RefY},
        {"rotate", PropertyID::Rotate},
        {"rx", PropertyID::Rx},
        {"ry", PropertyID::Ry},
        {"spreadMethod", PropertyID::SpreadMethod},
        {"style", PropertyID::Style},
        {"textLength", PropertyID::TextLength},
        {"transform", PropertyID::Transform},
        {"viewBox", PropertyID::ViewBox},
        {"width", PropertyID::Width},
        {"x", PropertyID::X},
        {"x1", PropertyID::X1},
        {"x2", PropertyID::X2},
        {"xlink:href", PropertyID::Href},
        {"xml:space", PropertyID::WhiteSpace},
        {"y", PropertyID::Y},
        {"y1", PropertyID::Y1},
        {"y2", PropertyID::Y2}
    };

    auto it = std::lower_bound(table, std::end(table), name, [](const auto& item, const auto& name) { return item.name < name; });
    if(it == std::end(table) || it->name != name)
        return csspropertyid(name);
    return it->value;
}